

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_radix_sort.h
# Opt level: O3

uint * crnlib::indirect_radix_sort<unsigned_int,unsigned_short>
                 (uint num_indices,uint *pIndices0,uint *pIndices1,unsigned_short *pKeys,
                 uint key_ofs,uint key_size,bool init_indices)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  uint *puVar8;
  byte bVar9;
  uint uVar10;
  uint *puVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint offsets [256];
  uint hist [1024];
  uint auStack_1438 [256];
  int local_1038 [256];
  int aiStack_c38 [256];
  int aiStack_838 [256];
  int aiStack_438 [258];
  
  uVar5 = (ulong)key_ofs;
  if (init_indices) {
    if ((num_indices & 0xfffffffe) == 0) {
      lVar7 = 0;
      puVar8 = pIndices0;
    }
    else {
      puVar8 = pIndices0 + (num_indices & 0xfffffffe);
      lVar7 = 0;
      do {
        puVar11 = pIndices0 + lVar7;
        *puVar11 = (uint)lVar7;
        puVar11[1] = (uint)lVar7 + 1;
        lVar7 = lVar7 + 2;
      } while (puVar11 + 2 != puVar8);
    }
    if ((num_indices & 1) != 0) {
      *puVar8 = (uint)lVar7;
    }
  }
  memset(local_1038,0,(ulong)key_size << 10);
  puVar8 = (uint *)0x0;
  switch(key_size) {
  case 1:
    puVar8 = pIndices0;
    if ((num_indices & 0xfffffffe) != 0) {
      puVar8 = pIndices0 + (num_indices & 0xfffffffe);
      puVar11 = pIndices0;
      do {
        bVar9 = *(byte *)((long)pKeys + (ulong)puVar11[1] * 2 + uVar5);
        local_1038[*(byte *)((long)pKeys + (ulong)*puVar11 * 2 + uVar5)] =
             local_1038[*(byte *)((long)pKeys + (ulong)*puVar11 * 2 + uVar5)] + 1;
        local_1038[bVar9] = local_1038[bVar9] + 1;
        puVar11 = puVar11 + 2;
      } while (puVar11 != puVar8);
    }
    if ((num_indices & 1) != 0) {
      uVar6 = (uint)*(byte *)((long)pKeys + uVar5 + (ulong)*puVar8 * 2);
LAB_00199034:
      local_1038[uVar6] = local_1038[uVar6] + 1;
    }
    break;
  case 2:
    puVar8 = pIndices0;
    if ((num_indices & 0xfffffffe) != 0) {
      puVar8 = pIndices0 + (num_indices & 0xfffffffe);
      puVar11 = pIndices0;
      do {
        uVar6 = *(uint *)((long)pKeys + (ulong)*puVar11 * 2 + uVar5);
        uVar14 = *(uint *)((long)pKeys + (ulong)puVar11[1] * 2 + uVar5);
        local_1038[uVar6 & 0xff] = local_1038[uVar6 & 0xff] + 1;
        piVar1 = (int *)((long)aiStack_c38 + (ulong)(uVar6 >> 6 & 0x3fc));
        *piVar1 = *piVar1 + 1;
        local_1038[uVar14 & 0xff] = local_1038[uVar14 & 0xff] + 1;
        piVar1 = (int *)((long)aiStack_c38 + (ulong)(uVar14 >> 6 & 0x3fc));
        *piVar1 = *piVar1 + 1;
        puVar11 = puVar11 + 2;
      } while (puVar11 != puVar8);
    }
    if ((num_indices & 1) != 0) {
      uVar6 = *(uint *)((long)pKeys + uVar5 + (ulong)*puVar8 * 2);
      local_1038[uVar6 & 0xff] = local_1038[uVar6 & 0xff] + 1;
      uVar6 = uVar6 >> 8 & 0xff | 0x100;
      goto LAB_00199034;
    }
    break;
  case 3:
    if (num_indices != 0) {
      lVar7 = 0;
      do {
        uVar6 = *(uint *)((long)pKeys + (ulong)*(uint *)((long)pIndices0 + lVar7) * 2 + uVar5);
        local_1038[uVar6 & 0xff] = local_1038[uVar6 & 0xff] + 1;
        piVar1 = (int *)((long)aiStack_c38 + (ulong)(uVar6 >> 6 & 0x3fc));
        *piVar1 = *piVar1 + 1;
        piVar1 = (int *)((long)aiStack_838 + (ulong)(uVar6 >> 0xe & 0x3fc));
        *piVar1 = *piVar1 + 1;
        lVar7 = lVar7 + 4;
      } while ((ulong)num_indices << 2 != lVar7);
      break;
    }
    goto LAB_00199046;
  case 4:
    if (num_indices == 0) goto LAB_00199046;
    lVar7 = 0;
    do {
      uVar6 = *(uint *)((long)pKeys + (ulong)*(uint *)((long)pIndices0 + lVar7) * 2 + uVar5);
      local_1038[uVar6 & 0xff] = local_1038[uVar6 & 0xff] + 1;
      piVar1 = (int *)((long)aiStack_c38 + (ulong)(uVar6 >> 6 & 0x3fc));
      *piVar1 = *piVar1 + 1;
      piVar1 = (int *)((long)aiStack_838 + (ulong)(uVar6 >> 0xe & 0x3fc));
      *piVar1 = *piVar1 + 1;
      piVar1 = (int *)((long)aiStack_438 + (ulong)(uVar6 >> 0x16 & 0xfffffffc));
      *piVar1 = *piVar1 + 1;
      lVar7 = lVar7 + 4;
    } while ((ulong)num_indices << 2 != lVar7);
    break;
  default:
    goto switchD_00198e67_default;
  }
  puVar8 = pIndices0;
  if (key_size != 0) {
LAB_00199046:
    uVar6 = 0;
    uVar13 = 0;
    do {
      puVar8 = pIndices1;
      uVar12 = 0xfffffffffffffffe;
      uVar14 = 0;
      do {
        auStack_1438[uVar12 + 2] = uVar14;
        iVar2 = local_1038[(ulong)(uVar6 >> 8) * 0x100 + uVar12 + 2];
        auStack_1438[uVar12 + 3] = uVar14 + iVar2;
        uVar14 = uVar14 + iVar2 + local_1038[(ulong)(uVar6 >> 8) * 0x100 + uVar12 + 3];
        uVar12 = uVar12 + 2;
      } while (uVar12 < 0xfe);
      bVar9 = (char)uVar13 * '\b';
      puVar11 = pIndices0;
      if ((ulong)(num_indices & 0xfffffffe) != 0) {
        do {
          uVar14 = *puVar11;
          uVar3 = puVar11[1];
          uVar15 = *(uint *)((long)pKeys + (ulong)uVar14 * 2 + uVar5) >> (bVar9 & 0x1f) & 0xff;
          uVar10 = *(uint *)((long)pKeys + (ulong)uVar3 * 2 + uVar5) >> (bVar9 & 0x1f) & 0xff;
          uVar4 = auStack_1438[uVar15];
          if (uVar15 == uVar10) {
            auStack_1438[uVar15] = uVar4 + 2;
            puVar8[uVar4] = uVar14;
            uVar15 = uVar4 + 1;
          }
          else {
            auStack_1438[uVar15] = uVar4 + 1;
            uVar15 = auStack_1438[uVar10];
            auStack_1438[uVar10] = uVar15 + 1;
            puVar8[uVar4] = uVar14;
          }
          puVar8[uVar15] = uVar3;
          puVar11 = puVar11 + 2;
        } while (puVar11 != pIndices0 + (num_indices & 0xfffffffe));
      }
      if ((num_indices & 1) != 0) {
        puVar8[auStack_1438
               [(ulong)(*(uint *)((long)pKeys + (ulong)*puVar11 * 2 + uVar5) >> (bVar9 & 0x1f)) &
                0xff]] = *puVar11;
      }
      uVar13 = uVar13 + 1;
      uVar6 = uVar6 + 0x100;
      pIndices1 = pIndices0;
      pIndices0 = puVar8;
    } while (uVar13 != key_size);
  }
switchD_00198e67_default:
  return puVar8;
}

Assistant:

T* indirect_radix_sort(uint num_indices, T* pIndices0, T* pIndices1, const Q* pKeys, uint key_ofs, uint key_size, bool init_indices) {
  CRNLIB_ASSERT_OPEN_RANGE(key_ofs, 0, sizeof(T));
  CRNLIB_ASSERT_CLOSED_RANGE(key_size, 1, 4);

  if (init_indices) {
    T* p = pIndices0;
    T* q = pIndices0 + (num_indices >> 1) * 2;
    uint i;
    for (i = 0; p != q; p += 2, i += 2) {
      p[0] = static_cast<T>(i);
      p[1] = static_cast<T>(i + 1);
    }

    if (num_indices & 1)
      *p = static_cast<T>(i);
  }

  uint hist[256 * 4];

  memset(hist, 0, sizeof(hist[0]) * 256 * key_size);

#define CRNLIB_GET_KEY(p) (*(const uint*)((const uint8*)(pKeys + *(p)) + key_ofs))
#define CRNLIB_GET_KEY_FROM_INDEX(i) (*(const uint*)((const uint8*)(pKeys + (i)) + key_ofs))

  if (key_size == 4) {
    T* p = pIndices0;
    T* q = pIndices0 + num_indices;
    for (; p != q; p++) {
      const uint key = CRNLIB_GET_KEY(p);

      hist[key & 0xFF]++;
      hist[256 + ((key >> 8) & 0xFF)]++;
      hist[512 + ((key >> 16) & 0xFF)]++;
      hist[768 + ((key >> 24) & 0xFF)]++;
    }
  } else if (key_size == 3) {
    T* p = pIndices0;
    T* q = pIndices0 + num_indices;
    for (; p != q; p++) {
      const uint key = CRNLIB_GET_KEY(p);

      hist[key & 0xFF]++;
      hist[256 + ((key >> 8) & 0xFF)]++;
      hist[512 + ((key >> 16) & 0xFF)]++;
    }
  } else if (key_size == 2) {
    T* p = pIndices0;
    T* q = pIndices0 + (num_indices >> 1) * 2;

    for (; p != q; p += 2) {
      const uint key0 = CRNLIB_GET_KEY(p);
      const uint key1 = CRNLIB_GET_KEY(p + 1);

      hist[key0 & 0xFF]++;
      hist[256 + ((key0 >> 8) & 0xFF)]++;

      hist[key1 & 0xFF]++;
      hist[256 + ((key1 >> 8) & 0xFF)]++;
    }

    if (num_indices & 1) {
      const uint key = CRNLIB_GET_KEY(p);

      hist[key & 0xFF]++;
      hist[256 + ((key >> 8) & 0xFF)]++;
    }
  } else {
    CRNLIB_ASSERT(key_size == 1);
    if (key_size != 1)
      return NULL;

    T* p = pIndices0;
    T* q = pIndices0 + (num_indices >> 1) * 2;

    for (; p != q; p += 2) {
      const uint key0 = CRNLIB_GET_KEY(p);
      const uint key1 = CRNLIB_GET_KEY(p + 1);

      hist[key0 & 0xFF]++;
      hist[key1 & 0xFF]++;
    }

    if (num_indices & 1) {
      const uint key = CRNLIB_GET_KEY(p);

      hist[key & 0xFF]++;
    }
  }

  T* pCur = pIndices0;
  T* pNew = pIndices1;

  for (uint pass = 0; pass < key_size; pass++) {
    const uint* pHist = &hist[pass << 8];

    uint offsets[256];

    uint cur_ofs = 0;
    for (uint i = 0; i < 256; i += 2) {
      offsets[i] = cur_ofs;
      cur_ofs += pHist[i];

      offsets[i + 1] = cur_ofs;
      cur_ofs += pHist[i + 1];
    }

    const uint pass_shift = pass << 3;

    T* p = pCur;
    T* q = pCur + (num_indices >> 1) * 2;

    for (; p != q; p += 2) {
      uint index0 = p[0];
      uint index1 = p[1];

      uint c0 = (CRNLIB_GET_KEY_FROM_INDEX(index0) >> pass_shift) & 0xFF;
      uint c1 = (CRNLIB_GET_KEY_FROM_INDEX(index1) >> pass_shift) & 0xFF;

      if (c0 == c1) {
        uint dst_offset0 = offsets[c0];

        offsets[c0] = dst_offset0 + 2;

        pNew[dst_offset0] = static_cast<T>(index0);
        pNew[dst_offset0 + 1] = static_cast<T>(index1);
      } else {
        uint dst_offset0 = offsets[c0]++;
        uint dst_offset1 = offsets[c1]++;

        pNew[dst_offset0] = static_cast<T>(index0);
        pNew[dst_offset1] = static_cast<T>(index1);
      }
    }

    if (num_indices & 1) {
      uint index = *p;
      uint c = (CRNLIB_GET_KEY_FROM_INDEX(index) >> pass_shift) & 0xFF;

      uint dst_offset = offsets[c];
      offsets[c] = dst_offset + 1;

      pNew[dst_offset] = static_cast<T>(index);
    }

    T* t = pCur;
    pCur = pNew;
    pNew = t;
  }

  return pCur;
}